

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O0

void __thiscall QEvdevMouseHandler::readMouseData(QEvdevMouseHandler *this)

{
  undefined1 auVar1 [16];
  QPoint _t1;
  QPoint _t1_00;
  QPoint _t1_01;
  QPoint _t1_02;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  qint64 qVar6;
  int *piVar7;
  Type TVar8;
  long lVar9;
  QEvdevMouseHandler *in_RDI;
  long in_FS_OFFSET;
  int distanceSquared;
  MouseButton button;
  input_event *data;
  int i;
  int result;
  bool pendingMouseEvent;
  bool btnChanged;
  bool posChanged;
  int n;
  QPoint delta;
  input_event buffer [32];
  Representation in_stack_fffffffffffffc68;
  Representation in_stack_fffffffffffffc6c;
  QPoint *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc88;
  MouseButton flag;
  QFlags<Qt::MouseButton> *this_00;
  int local_368;
  int local_35c;
  char local_328 [32];
  QFlags<Qt::MouseButton> local_308 [4];
  ushort auStack_2f8 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_308,0xaa,0x300);
  local_35c = 0;
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  do {
    while( true ) {
      qVar6 = qt_safe_read((int)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffc78,
                           (qint64)in_stack_fffffffffffffc70);
      iVar5 = (int)qVar6;
      if (iVar5 == 0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_RDI,in_stack_fffffffffffffc78,
                   (int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffc6c.m_i,in_stack_fffffffffffffc68.m_i));
        QMessageLogger::warning(local_328,"evdevmouse: Got EOF from the input device");
        goto LAB_00147f5e;
      }
      if (iVar5 < 0) break;
      local_35c = iVar5 + local_35c;
      if ((ulong)(long)local_35c % 0x18 == 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)local_35c;
        for (local_368 = 0; local_368 < SUB164(auVar1 / ZEXT816(0x18),0); local_368 = local_368 + 1)
        {
          lVar9 = (long)local_368;
          this_00 = local_308 + lVar9 * 6;
          if (auStack_2f8[lVar9 * 0xc] == 3) {
            if ((auStack_2f8[lVar9 * 0xc + 1] == 0) &&
               (in_RDI->m_x != *(int *)(auStack_2f8 + lVar9 * 0xc + 2))) {
              in_RDI->m_x = *(int *)(auStack_2f8 + lVar9 * 0xc + 2);
              bVar3 = true;
            }
            else if ((auStack_2f8[lVar9 * 0xc + 1] == 1) &&
                    (in_RDI->m_y != *(int *)(auStack_2f8 + lVar9 * 0xc + 2))) {
              in_RDI->m_y = *(int *)(auStack_2f8 + lVar9 * 0xc + 2);
              bVar3 = true;
            }
          }
          else if (auStack_2f8[lVar9 * 0xc] == 2) {
            QPoint::QPoint(in_stack_fffffffffffffc70);
            if (*(short *)((long)&this_00[4].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                  super_QFlagsStorage<Qt::MouseButton>.i + 2) == 0) {
              in_RDI->m_x = this_00[5].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                            super_QFlagsStorage<Qt::MouseButton>.i + in_RDI->m_x;
              bVar3 = true;
            }
            else if (*(short *)((long)&this_00[4].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                       super_QFlagsStorage<Qt::MouseButton>.i + 2) == 1) {
              in_RDI->m_y = this_00[5].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                            super_QFlagsStorage<Qt::MouseButton>.i + in_RDI->m_y;
              bVar3 = true;
            }
            else if (((in_RDI->m_hiResWheel & 1U) == 0) &&
                    (*(short *)((long)&this_00[4].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                       super_QFlagsStorage<Qt::MouseButton>.i + 2) == 8)) {
              QPoint::setY(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c.m_i);
              _t1.yp.m_i = in_stack_fffffffffffffc6c.m_i;
              _t1.xp.m_i = in_stack_fffffffffffffc68.m_i;
              handleWheelEvent((QEvdevMouseHandler *)0x147bec,_t1);
            }
            else if (*(short *)((long)&this_00[4].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                       super_QFlagsStorage<Qt::MouseButton>.i + 2) == 0xb) {
              QPoint::setY(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c.m_i);
              _t1_00.yp.m_i = in_stack_fffffffffffffc6c.m_i;
              _t1_00.xp.m_i = in_stack_fffffffffffffc68.m_i;
              handleWheelEvent((QEvdevMouseHandler *)0x147c2a,_t1_00);
            }
            else if (((in_RDI->m_hiResHWheel & 1U) == 0) &&
                    (*(short *)((long)&this_00[4].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                       super_QFlagsStorage<Qt::MouseButton>.i + 2) == 6)) {
              QPoint::setX(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c.m_i);
              _t1_01.yp.m_i = in_stack_fffffffffffffc6c.m_i;
              _t1_01.xp.m_i = in_stack_fffffffffffffc68.m_i;
              handleWheelEvent((QEvdevMouseHandler *)0x147c77,_t1_01);
            }
            else if (*(short *)((long)&this_00[4].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                                       super_QFlagsStorage<Qt::MouseButton>.i + 2) == 0xc) {
              QPoint::setX(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c.m_i);
              _t1_02.yp.m_i = in_stack_fffffffffffffc6c.m_i;
              _t1_02.xp.m_i = in_stack_fffffffffffffc68.m_i;
              handleWheelEvent((QEvdevMouseHandler *)0x147cb4,_t1_02);
            }
          }
          else if ((auStack_2f8[lVar9 * 0xc] == 1) && (auStack_2f8[lVar9 * 0xc + 1] == 0x14a)) {
            in_RDI->m_prevInvalid = true;
          }
          else if ((auStack_2f8[lVar9 * 0xc] == 1) &&
                  ((0x10f < auStack_2f8[lVar9 * 0xc + 1] && (auStack_2f8[lVar9 * 0xc + 1] < 0x121)))
                  ) {
            flag = NoButton;
            in_stack_fffffffffffffc70 = (QPoint *)(ulong)(auStack_2f8[lVar9 * 0xc + 1] - 0x110);
            switch(in_stack_fffffffffffffc70) {
            case (QPoint *)0x0:
              flag = LeftButton;
              break;
            case (QPoint *)0x1:
              flag = RightButton;
              break;
            case (QPoint *)0x2:
              flag = MiddleButton;
              break;
            case (QPoint *)0x3:
              flag = BackButton;
              break;
            case (QPoint *)0x4:
              flag = ExtraButton2;
              break;
            case (QPoint *)0x5:
              flag = ExtraButton3;
              break;
            case (QPoint *)0x6:
              flag = ExtraButton4;
              break;
            case (QPoint *)0x7:
              flag = ExtraButton5;
              break;
            case (QPoint *)0x8:
              flag = ExtraButton6;
              break;
            case (QPoint *)0x9:
              flag = ExtraButton7;
              break;
            case (QPoint *)0xa:
              flag = ExtraButton8;
              break;
            case (QPoint *)0xb:
              flag = ExtraButton9;
              break;
            case (QPoint *)0xc:
              flag = ExtraButton10;
              break;
            case (QPoint *)0xd:
              flag = ExtraButton11;
              break;
            case (QPoint *)0xe:
              flag = ExtraButton12;
              break;
            case (QPoint *)0xf:
              flag = ExtraButton13;
            }
            QFlags<Qt::MouseButton>::setFlag
                      (this_00,flag,SUB41((uint)in_stack_fffffffffffffc88 >> 0x18,0));
            in_RDI->m_button = flag;
            TVar8 = MouseButtonPress;
            if (this_00[5].super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                super_QFlagsStorage<Qt::MouseButton>.i == 0) {
              TVar8 = MouseButtonRelease;
            }
            in_RDI->m_eventType = TVar8;
            bVar2 = true;
          }
          else if ((auStack_2f8[lVar9 * 0xc] == 0) && (auStack_2f8[lVar9 * 0xc + 1] == 0)) {
            if (bVar2) {
              bVar3 = false;
              bVar2 = false;
              sendMouseEvent(in_RDI);
              bVar4 = false;
            }
            else if (bVar3) {
              in_RDI->m_eventType = MouseMove;
              bVar3 = false;
              if ((in_RDI->m_compression & 1U) == 0) {
                sendMouseEvent(in_RDI);
              }
              else {
                bVar4 = true;
              }
            }
          }
        }
        if ((((in_RDI->m_compression & 1U) != 0) && (bVar4)) &&
           (in_RDI->m_jitterLimitSquared <
            (in_RDI->m_x - in_RDI->m_prevx) * (in_RDI->m_x - in_RDI->m_prevx) +
            (in_RDI->m_y - in_RDI->m_prevy) * (in_RDI->m_y - in_RDI->m_prevy))) {
          sendMouseEvent(in_RDI);
        }
        goto LAB_00147f5e;
      }
    }
    piVar7 = __errno_location();
  } while ((*piVar7 == 4) || (piVar7 = __errno_location(), *piVar7 == 0xb));
  piVar7 = __errno_location();
  iVar5 = (int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
  qErrnoWarning(*piVar7,"evdevmouse: Could not read from input device");
  piVar7 = __errno_location();
  if (*piVar7 == 0x13) {
    if (in_RDI->m_notify != (QSocketNotifier *)0x0) {
      (**(code **)(*(long *)in_RDI->m_notify + 0x20))();
    }
    in_RDI->m_notify = (QSocketNotifier *)0x0;
    qt_safe_close(iVar5);
    in_RDI->m_fd = -1;
  }
LAB_00147f5e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevMouseHandler::readMouseData()
{
    struct ::input_event buffer[32];
    int n = 0;
    bool posChanged = false, btnChanged = false;
    bool pendingMouseEvent = false;
    forever {
        int result = QT_READ(m_fd, reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevmouse: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning(errno, "evdevmouse: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    qt_safe_close(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }